

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
MessageVisitor<should_convert_from_ref::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)76>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
          (undefined8 param_1,undefined8 *valueToken,long message,undefined8 param_4,undefined4 tag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  
  lVar1 = valueToken[1];
  lVar2 = *(long *)(*(long *)*valueToken + 8);
  lVar3 = *(long *)(*(long *)*valueToken + 0x10);
  uVar4 = valueToken[3];
  if (*(ulong *)(message + 0x90) <= *(ulong *)(message + 0x88)) {
    llvm::
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
            *)(message + 0x80),0);
  }
  puVar5 = *(undefined4 **)(message + 0x88);
  *puVar5 = tag;
  *(undefined8 *)(puVar5 + 2) = uVar4;
  *(long *)(puVar5 + 4) = lVar3 - (lVar1 + lVar2);
  *(long *)(message + 0x88) = *(long *)(message + 0x88) + 0x18;
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }